

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O2

QString * __thiscall
VcprojGenerator::extraCompilerName
          (QString *__return_storage_ptr__,VcprojGenerator *this,ProString *extraCompiler,
          QStringList *inputs,QStringList *outputs)

{
  QMakeProject *this_00;
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  ProStringList *this_01;
  long in_FS_OFFSET;
  QStringBuilder<const_ProString_&,_const_char_(&)[6]> local_78;
  ProString local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = -0x5555555555555556;
  (__return_storage_ptr__->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  this_00 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  local_78.b = (char (*) [6])0x22521b;
  local_78.a = extraCompiler;
  ProString::ProString<ProString_const&,char_const(&)[6]>(&local_68,&local_78);
  this_01 = QMakeEvaluator::valuesRef(&this_00->super_QMakeEvaluator,(ProKey *)&local_68);
  ProStringList::join(__return_storage_ptr__,this_01,(QChar)0x20);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  if ((__return_storage_ptr__->d).size == 0) {
    ProString::toQString(&local_68.m_string,extraCompiler);
  }
  else {
    (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
      _vptr_QMakeSourceFileInfo[0xb])(&local_68,this,__return_storage_ptr__,inputs,outputs,0);
  }
  pDVar2 = (__return_storage_ptr__->d).d;
  pcVar3 = (__return_storage_ptr__->d).ptr;
  (__return_storage_ptr__->d).d = local_68.m_string.d.d;
  (__return_storage_ptr__->d).ptr = local_68.m_string.d.ptr;
  qVar1 = (__return_storage_ptr__->d).size;
  (__return_storage_ptr__->d).size = local_68.m_string.d.size;
  local_68.m_string.d.d = pDVar2;
  local_68.m_string.d.ptr = pcVar3;
  local_68.m_string.d.size = qVar1;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString VcprojGenerator::extraCompilerName(const ProString &extraCompiler,
                                             const QStringList &inputs,
                                             const QStringList &outputs)
{
    QString name = project->values(ProKey(extraCompiler + ".name")).join(' ');
    if (name.isEmpty())
        name = extraCompiler.toQString();
    else
        name = replaceExtraCompilerVariables(name, inputs, outputs, NoShell);
    return name;
}